

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O0

ixy_device * virtio_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  uint16_t uVar1;
  __uid_t _Var2;
  int iVar3;
  ixy_device *piVar4;
  char *pcVar5;
  ushort in_DX;
  ushort in_SI;
  char *in_RDI;
  uint16_t device_id;
  int config;
  virtio_device *dev;
  int in_stack_00001204;
  char *in_stack_00001208;
  char *in_stack_00001210;
  char *in_stack_00001220;
  char *in_stack_00001420;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  _Var2 = getuid();
  if (_Var2 != 0) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): Not running as root, this will probably fail\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x147,"virtio_init");
  }
  if (1 < in_SI) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d rx queues: limit is %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x14a,"virtio_init",(ulong)in_SI,1);
    abort();
  }
  if (1 < in_DX) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): cannot configure %d tx queues: limit is %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x14d,"virtio_init",(ulong)in_DX,1);
    abort();
  }
  remove_driver(in_stack_00001220);
  piVar4 = (ixy_device *)calloc(1,0xb0);
  pcVar5 = strdup(in_RDI);
  piVar4->pci_addr = pcVar5;
  piVar4->driver_name = driver_name;
  piVar4->num_rx_queues = in_SI;
  piVar4->num_tx_queues = in_DX;
  piVar4->rx_batch = virtio_rx_batch;
  piVar4->tx_batch = virtio_tx_batch;
  piVar4->read_stats = virtio_read_stats;
  piVar4->set_promisc = virtio_set_promisc;
  piVar4->get_link_speed = virtio_get_link_speed;
  enable_dma(in_stack_00001420);
  iVar3 = pci_open_resource(in_stack_00001210,in_stack_00001208,in_stack_00001204);
  uVar1 = read_io16(iVar3,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  close(iVar3);
  if (uVar1 == 0x1000) {
    fprintf(_stdout,"[INFO ] %s:%d %s(): Detected virtio legacy network card\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x160,"virtio_init");
    iVar3 = pci_open_resource(in_stack_00001210,in_stack_00001208,in_stack_00001204);
    *(int *)&piVar4[1].pci_addr = iVar3;
    virtio_legacy_init((virtio_device *)CONCAT26(in_SI,CONCAT24(in_DX,in_stack_fffffffffffffff0)));
    return piVar4;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Modern device not supported\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
          0x164,"virtio_init");
  abort();
}

Assistant:

struct ixy_device* virtio_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > 1) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, 1);
	}
	if (tx_queues > 1) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, 1);
	}
	remove_driver(pci_addr);
	struct virtio_device* dev = calloc(1, sizeof(*dev));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = virtio_rx_batch;
	dev->ixy.tx_batch = virtio_tx_batch;
	dev->ixy.read_stats = virtio_read_stats;
	dev->ixy.set_promisc = virtio_set_promisc;
	dev->ixy.get_link_speed = virtio_get_link_speed;
	enable_dma(pci_addr);
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t device_id = read_io16(config, 2);
	close(config);
	// Check config if device is legacy network card
	if (device_id == 0x1000) {
		info("Detected virtio legacy network card");
		dev->fd = pci_open_resource(pci_addr, "resource0", O_RDWR);
		virtio_legacy_init(dev);
	} else {
		error("Modern device not supported");
	}
	return &dev->ixy;
}